

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O3

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,DSVectorBase<double> *vec)

{
  int iVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  Nonzero<double> *pNVar4;
  
  if (this != vec) {
    (this->super_SVectorBase<double>).memused = 0;
    makeMem(this,(vec->super_SVectorBase<double>).memused);
    iVar1 = (vec->super_SVectorBase<double>).memused;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      pNVar3 = (vec->super_SVectorBase<double>).m_elem;
      pNVar4 = (this->super_SVectorBase<double>).m_elem;
      iVar2 = 0;
      do {
        if ((pNVar3->val != 0.0) || (NAN(pNVar3->val))) {
          pNVar4->idx = pNVar3->idx;
          pNVar4->val = pNVar3->val;
          pNVar4 = pNVar4 + 1;
          iVar2 = iVar2 + 1;
        }
        iVar1 = iVar1 + -1;
        pNVar3 = pNVar3 + 1;
      } while (iVar1 != 0);
    }
    (this->super_SVectorBase<double>).memused = iVar2;
  }
  return this;
}

Assistant:

DSVectorBase<R>& operator=(const DSVectorBase<R>& vec)
   {
      if(this != &vec)
      {
         SVectorBase<R>::clear();
         makeMem(vec.size());
         SVectorBase<R>::operator=(vec);
      }

      return *this;
   }